

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O1

ssize_t __thiscall HttpConn::write(HttpConn *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  Channel *pCVar3;
  EventLoop *this_00;
  bool bVar4;
  code *in_RAX;
  code *extraout_RAX;
  code *extraout_RAX_00;
  undefined7 extraout_var;
  Logger local_1020;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_38 = in_RAX;
  if (this->writeable_ == true) {
    uVar1 = this->write_idx_;
    local_38 = (code *)(ulong)uVar1;
    uVar2 = this->send_idx_;
    if (uVar1 != uVar2) {
      local_38 = (code *)writen(this->fd_,
                                (this->writeBuff_).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_start + (int)uVar2,
                                (long)(int)(uVar1 - uVar2));
      if ((int)local_38 < 0) {
        Logger::Logger(&local_1020,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/HttpConn.cpp"
                       ,0x8c);
        if (0x26 < ((int)&local_1020 + 0xfa8) - (int)local_1020.impl_.stream_.buffer_.cur_) {
          builtin_strncpy(local_1020.impl_.stream_.buffer_.cur_,
                          "Http Response Error: HttpConn::write()",0x26);
          local_1020.impl_.stream_.buffer_.cur_ = local_1020.impl_.stream_.buffer_.cur_ + 0x26;
        }
        Logger::~Logger(&local_1020);
        local_38 = extraout_RAX;
      }
      else {
        this->send_idx_ = this->send_idx_ + (int)local_38;
      }
    }
  }
  if ((this->parseState_ == Finished) &&
     (local_38 = (code *)(ulong)(uint)this->write_idx_, this->write_idx_ == this->send_idx_)) {
    if ((this->connStatus_ == Connected) && (this->linger_ == true)) {
      this->parseState_ = CheckRequestLine;
      this->read_idx_ = 0;
      this->checked_idx_ = 0;
      this->write_idx_ = 0;
      this->send_idx_ = 0;
      this->readable_ = true;
      this->writeable_ = false;
      pCVar3 = (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pCVar3->events_ = -0x7ffffffb;
      Channel::update(pCVar3);
      local_38 = extraout_RAX_00;
    }
    else {
      pCVar3 = (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pCVar3->events_ = 0;
      Channel::update(pCVar3);
      this_00 = this->loop_;
      local_38 = (code *)0x0;
      pcStack_30 = (code *)0x0;
      local_48._M_unused._M_object = (void *)0x0;
      local_48._8_8_ = 0;
      local_48._M_unused._M_object = operator_new(0x18);
      *(code **)local_48._M_unused._0_8_ = close;
      *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
      *(HttpConn **)((long)local_48._M_unused._0_8_ + 0x10) = this;
      pcStack_30 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                   _M_invoke;
      local_38 = std::_Function_handler<void_(),_std::_Bind<void_(HttpConn::*(HttpConn_*))()>_>::
                 _M_manager;
      EventLoop::runInLoop(this_00,(Functor *)&local_48);
      if (local_38 != (code *)0x0) {
        bVar4 = (*local_38)(&local_48,&local_48,__destroy_functor);
        local_38 = (code *)CONCAT71(extraout_var,bVar4);
      }
    }
  }
  return (ssize_t)local_38;
}

Assistant:

void HttpConn::write() {
    if (writeable_ && write_idx_ != send_idx_) {
        int writeBytes;
        if ((writeBytes = writen(fd_, writeBuff_.data() + send_idx_, write_idx_ - send_idx_)) < 0) {
            LOG << "Http Response Error: HttpConn::write()";
        } else {
            send_idx_ += writeBytes;
        }
    }

    if (parseState_ == Finished && write_idx_ == send_idx_) {
        if (connStatus_ == Connected && linger_) {
            reset();
            channel_->update();
        } else {
            channel_->setEvent(0);
            channel_->update();
            loop_->runInLoop(std::bind(&HttpConn::close, this));
            return;
        }
    }
    //handleConn();
}